

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O2

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::checkCandidate
          (ClauseMatcher *this,Clause *cl,int *resolvedQueryLit)

{
  LitInfo *pLVar1;
  LiteralMatcher *this_00;
  bool bVar2;
  uint uVar3;
  MatchInfo **ppMVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = (uint)*(undefined8 *)&cl->field_0x38;
  uVar3 = uVar5 & 0xfffff;
  if (1 < uVar3) {
    uVar5 = uVar5 & 0xfffff;
    uVar7 = (ulong)uVar5;
    uVar6 = (ulong)(uVar5 << 4);
    while ((0 < (long)uVar7 &&
           (this_00 = *(LiteralMatcher **)
                       ((long)&(this->lms)._stack[-1]._self._M_t.
                               super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                               .
                               super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>
                               ._M_head_impl + uVar6), this_00->_eagerlyMatched == false))) {
      if (*(int *)((((this_00->super_Matcher).super_BaseMatcher.op)->_content >> 3) + 0x10) != 0) {
        LiteralMatcher::doEagerMatching(this_00);
      }
      uVar7 = uVar7 - 1;
      uVar6 = uVar6 - 0x10;
    }
    bVar2 = matchGlobalVars(this,resolvedQueryLit);
    return bVar2;
  }
  *resolvedQueryLit = -1;
  if ((uVar3 == 1) && (this->sres != false)) {
    uVar3 = *(uint *)((**(ulong **)
                         &((((this->lms)._stack)->_self)._M_t.
                           super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                           .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>
                          ._M_head_impl)->super_Matcher >> 3) + 0x34);
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      ppMVar4 = CodeTree::ILStruct::getMatch
                          ((ILStruct *)
                           (**(ulong **)
                              &((((this->lms)._stack)->_self)._M_t.
                                super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                .
                                super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>
                               ._M_head_impl)->super_Matcher >> 3),(uint)uVar6);
      pLVar1 = (this->lInfos)._array;
      if (pLVar1[*(uint *)*ppMVar4].opposite != true) {
        *resolvedQueryLit = -1;
        return true;
      }
      *resolvedQueryLit = pLVar1[*(uint *)*ppMVar4].litIndex;
    }
  }
  return true;
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::checkCandidate(Clause* cl, int& resolvedQueryLit)
{
  unsigned clen=cl->length();
  //the last matcher in mls is the one that yielded the SUCCESS operation
  ASS_EQ(clen, lms.size()-1);
  ASS_EQ(clen, lms[clen-1]->op->getILS()->depth+1);

  if(clen<=1) {
    //if clause doesn't have multiple literals, there is no need
    //for multi-literal matching
    resolvedQueryLit=-1;
    if(sres && clen==1) {
      size_t matchCnt=lms[0]->getILS()->matchCnt;
      for(size_t i=0;i<matchCnt;i++) {
	MatchInfo* mi=lms[0]->getILS()->getMatch(i);
	if(lInfos[mi->liIndex].opposite) {
	  resolvedQueryLit=lInfos[mi->liIndex].litIndex;
	}
	else {
	  //we prefer subsumption to subsumption resolution
	  resolvedQueryLit=-1;
	  break;
	}
      }
    }
    return true;
  }

//  if(matchGlobalVars(resolvedQueryLit)) {
//    return true;
//  }

  bool newMatches=false;
  for(int i=clen-1;i>=0;i--) {
    LiteralMatcher* lm = &*lms[i];
    if(lm->eagerlyMatched()) {
      break;
    }
    if(lm->getILS()->varCnt==0) {
      //If the index term is ground, at most two literals can be matched on
      //it (the second one is the opposite one in case we're performing the
      //subsumption resolution) We are here, so we have matched one already,
      //and we know that the query clause doesn't contain two equal or opposite
      //literals (or else it would have been simplified by duplicate literal
      //removal or by tautology deletion). Therefore we don't need to try
      //matching the rest of the query clause.
      continue;
    }
    newMatches|=lm->doEagerMatching();
  }
  (void)newMatches; // to prevent a warning
  return matchGlobalVars(resolvedQueryLit);
//  return newMatches && matchGlobalVars(resolvedQueryLit);
}